

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.h
# Opt level: O2

UBool __thiscall
icu_63::ReorderingBuffer::appendBMP(ReorderingBuffer *this,UChar c,uint8_t cc,UErrorCode *errorCode)

{
  UChar *pUVar1;
  UChar *pUVar2;
  UBool UVar3;
  
  if ((this->remainingCapacity == 0) && (UVar3 = resize(this,1,errorCode), UVar3 == '\0')) {
    return '\0';
  }
  if ((cc == '\0') || (this->lastCC <= cc)) {
    pUVar2 = this->limit;
    pUVar1 = pUVar2 + 1;
    this->limit = pUVar1;
    *pUVar2 = c;
    this->lastCC = cc;
    if (cc < 2) {
      this->reorderStart = pUVar1;
    }
  }
  else {
    insert(this,(uint)(ushort)c,cc);
  }
  this->remainingCapacity = this->remainingCapacity + -1;
  return '\x01';
}

Assistant:

UBool appendBMP(UChar c, uint8_t cc, UErrorCode &errorCode) {
        if(remainingCapacity==0 && !resize(1, errorCode)) {
            return FALSE;
        }
        if(lastCC<=cc || cc==0) {
            *limit++=c;
            lastCC=cc;
            if(cc<=1) {
                reorderStart=limit;
            }
        } else {
            insert(c, cc);
        }
        --remainingCapacity;
        return TRUE;
    }